

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar4;
  OsStackTraceGetterInterface *pOVar5;
  TimeInMillis TVar6;
  TestInfo *this_02;
  TestSuite *in_RDI;
  int j;
  int i;
  Timer timer;
  bool skip_all;
  TestInfo *in_stack_00000040;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa4;
  UnitTestImpl *in_stack_ffffffffffffffb0;
  int local_40;
  int local_3c;
  
  if ((in_RDI->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,in_RDI);
  UnitTest::GetInstance();
  this_01 = UnitTest::listeners((UnitTest *)0x1848eb4);
  pTVar4 = TestEventListeners::repeater(this_01);
  (*pTVar4->_vptr_TestEventListener[6])(pTVar4,in_RDI);
  (*pTVar4->_vptr_TestEventListener[7])(pTVar4,in_RDI);
  pOVar5 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffb0);
  (*pOVar5->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000040,(offset_in_TestSuite_to_subr)timer.start_.__d.__r,_j);
  ad_hoc_test_result(in_RDI);
  bVar1 = TestResult::Failed((TestResult *)in_RDI);
  TVar6 = internal::GetTimeInMillis();
  in_RDI->start_timestamp_ = TVar6;
  internal::Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_3c = 0;
  while (iVar7 = local_3c, iVar3 = total_test_count((TestSuite *)0x1848f7a), iVar7 < iVar3) {
    iVar7 = (int)((ulong)in_RDI >> 0x20);
    if (bVar1) {
      GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffb0,iVar7);
      testing::TestInfo::Skip(in_stack_00000040);
    }
    else {
      GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffb0,iVar7);
      testing::TestInfo::Run((TestInfo *)this_00);
    }
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      this_02 = GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffb0,
                                   (int)((ulong)in_RDI >> 0x20));
      testing::TestInfo::result(this_02);
      bVar2 = TestResult::Failed((TestResult *)in_RDI);
      local_40 = local_3c;
      if (bVar2) goto LAB_01848ff8;
    }
    local_3c = local_3c + 1;
  }
LAB_0184904b:
  TVar6 = internal::Timer::Elapsed((Timer *)in_stack_ffffffffffffffb0);
  in_RDI->elapsed_time_ = TVar6;
  pOVar5 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffb0);
  (*pOVar5->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000040,(offset_in_TestSuite_to_subr)timer.start_.__d.__r,_j);
  (*pTVar4->_vptr_TestEventListener[0xc])(pTVar4,in_RDI);
  (*pTVar4->_vptr_TestEventListener[0xd])(pTVar4,in_RDI);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_01848ff8:
  while( true ) {
    local_40 = local_40 + 1;
    iVar7 = local_40;
    iVar3 = total_test_count((TestSuite *)0x184900a);
    if (iVar3 <= iVar7) break;
    GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
    testing::TestInfo::Skip(in_stack_00000040);
  }
  goto LAB_0184904b;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all = ad_hoc_test_result().Failed();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}